

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall cfd::core::TapBranch::TapBranch(TapBranch *this,ByteData256 *commitment)

{
  ByteData256 *commitment_local;
  TapBranch *this_local;
  
  this->_vptr_TapBranch = (_func_int **)&PTR__TapBranch_00896600;
  this->has_leaf_ = false;
  this->leaf_version_ = '\0';
  Script::Script(&this->script_);
  ByteData256::ByteData256(&this->root_commitment_);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::vector
            (&this->branch_list_);
  ByteData256::operator=(&this->root_commitment_,commitment);
  return;
}

Assistant:

TapBranch::TapBranch(const ByteData256& commitment)
    : has_leaf_(false), leaf_version_(0) {
  root_commitment_ = commitment;
}